

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align.h
# Opt level: O0

ArenaAlign google::protobuf::internal::ArenaAlignAs(size_t align)

{
  type tVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  LogMessage local_60;
  Voidify local_4d [13];
  LogMessage local_40;
  Voidify local_2d;
  uint local_2c;
  unsigned_long local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t align_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)align;
  local_28 = absl::lts_20250127::log_internal::GetReferenceableValue(align);
  local_2c = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_long,unsigned_int>
                       (&local_28,&local_2c,"align != 0U");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
               ,0x9e,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_2d,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  tVar1 = absl::lts_20250127::has_single_bit<unsigned_long>
                    ((unsigned_long)absl_log_internal_check_op_result);
  if (((tVar1 ^ 0xffU) & 1) == 0) {
    return (ArenaAlign)(size_t)absl_log_internal_check_op_result;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
             ,0x9f,"absl::has_single_bit(align)");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [19])"Invalid alignment ");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(unsigned_long)absl_log_internal_check_op_result);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_4d,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

inline ArenaAlign ArenaAlignAs(size_t align) {
  // align must be a non zero power of 2 >= 8
  ABSL_DCHECK_NE(align, 0U);
  ABSL_DCHECK(absl::has_single_bit(align)) << "Invalid alignment " << align;
  return ArenaAlign{align};
}